

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void AddVectorEq_SSE2(uint32_t *a,uint32_t *out,int size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  uint uVar17;
  undefined8 *puVar18;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  int aligned_size;
  int i;
  uint local_2c0;
  int local_158;
  int iStack_154;
  int local_148;
  int iStack_144;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  __m128i b0_3;
  __m128i a0_3;
  __m128i b0_2;
  __m128i a0_2;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  
  local_2c0 = 0;
  uVar17 = local_2c0;
  do {
    local_2c0 = uVar17;
    puVar18 = (undefined8 *)(in_RDI + (long)(int)local_2c0 * 4);
    uVar1 = *puVar18;
    uVar2 = puVar18[1];
    puVar18 = (undefined8 *)(in_RDI + (long)(int)(local_2c0 + 4) * 4);
    uVar3 = *puVar18;
    uVar4 = puVar18[1];
    puVar18 = (undefined8 *)(in_RDI + (long)(int)(local_2c0 + 8) * 4);
    uVar5 = *puVar18;
    uVar6 = puVar18[1];
    puVar18 = (undefined8 *)(in_RDI + (long)(int)(local_2c0 + 0xc) * 4);
    uVar7 = *puVar18;
    uVar8 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)local_2c0 * 4);
    uVar9 = *puVar18;
    uVar10 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)(local_2c0 + 4) * 4);
    uVar11 = *puVar18;
    uVar12 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)(local_2c0 + 8) * 4);
    uVar13 = *puVar18;
    uVar14 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)(local_2c0 + 0xc) * 4);
    uVar15 = *puVar18;
    uVar16 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)local_2c0 * 4);
    a0_3[1]._0_4_ = (int)uVar1;
    a0_3[1]._4_4_ = (int)((ulong)uVar1 >> 0x20);
    b0_2[0]._0_4_ = (int)uVar2;
    b0_2[0]._4_4_ = (int)((ulong)uVar2 >> 0x20);
    b0_3[1]._0_4_ = (int)uVar9;
    b0_3[1]._4_4_ = (int)((ulong)uVar9 >> 0x20);
    a0_3[0]._0_4_ = (int)uVar10;
    a0_3[0]._4_4_ = (int)((ulong)uVar10 >> 0x20);
    *puVar18 = CONCAT44(a0_3[1]._4_4_ + b0_3[1]._4_4_,(int)a0_3[1] + (int)b0_3[1]);
    puVar18[1] = CONCAT44(b0_2[0]._4_4_ + a0_3[0]._4_4_,(int)b0_2[0] + (int)a0_3[0]);
    puVar18 = (undefined8 *)(in_RSI + (long)(int)(local_2c0 + 4) * 4);
    iStack_88 = (int)uVar3;
    iStack_84 = (int)((ulong)uVar3 >> 0x20);
    b0_3[0]._0_4_ = (int)uVar4;
    b0_3[0]._4_4_ = (int)((ulong)uVar4 >> 0x20);
    local_98 = (int)uVar11;
    iStack_94 = (int)((ulong)uVar11 >> 0x20);
    iStack_90 = (int)uVar12;
    iStack_8c = (int)((ulong)uVar12 >> 0x20);
    *puVar18 = CONCAT44(iStack_84 + iStack_94,iStack_88 + local_98);
    puVar18[1] = CONCAT44(b0_3[0]._4_4_ + iStack_8c,(int)b0_3[0] + iStack_90);
    puVar18 = (undefined8 *)(in_RSI + (long)(int)(local_2c0 + 8) * 4);
    local_a8 = (int)uVar5;
    iStack_a4 = (int)((ulong)uVar5 >> 0x20);
    iStack_a0 = (int)uVar6;
    iStack_9c = (int)((ulong)uVar6 >> 0x20);
    local_b8 = (int)uVar13;
    iStack_b4 = (int)((ulong)uVar13 >> 0x20);
    iStack_b0 = (int)uVar14;
    iStack_ac = (int)((ulong)uVar14 >> 0x20);
    *puVar18 = CONCAT44(iStack_a4 + iStack_b4,local_a8 + local_b8);
    puVar18[1] = CONCAT44(iStack_9c + iStack_ac,iStack_a0 + iStack_b0);
    puVar18 = (undefined8 *)(in_RSI + (long)(int)(local_2c0 + 0xc) * 4);
    local_c8 = (int)uVar7;
    iStack_c4 = (int)((ulong)uVar7 >> 0x20);
    iStack_c0 = (int)uVar8;
    iStack_bc = (int)((ulong)uVar8 >> 0x20);
    local_d8 = (int)uVar15;
    iStack_d4 = (int)((ulong)uVar15 >> 0x20);
    iStack_d0 = (int)uVar16;
    iStack_cc = (int)((ulong)uVar16 >> 0x20);
    *puVar18 = CONCAT44(iStack_c4 + iStack_d4,local_c8 + local_d8);
    puVar18[1] = CONCAT44(iStack_bc + iStack_cc,iStack_c0 + iStack_d0);
    uVar17 = local_2c0 + 0x10;
  } while (uVar17 != (in_EDX & 0xfffffff0));
  if ((in_EDX & 8) != 0) {
    puVar18 = (undefined8 *)(in_RDI + (long)(int)uVar17 * 4);
    uVar1 = *puVar18;
    uVar2 = puVar18[1];
    puVar18 = (undefined8 *)(in_RDI + (long)(int)(local_2c0 + 0x14) * 4);
    uVar3 = *puVar18;
    uVar4 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)uVar17 * 4);
    uVar5 = *puVar18;
    uVar6 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)(local_2c0 + 0x14) * 4);
    uVar7 = *puVar18;
    uVar8 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)uVar17 * 4);
    local_e8 = (int)uVar1;
    iStack_e4 = (int)((ulong)uVar1 >> 0x20);
    iStack_e0 = (int)uVar2;
    iStack_dc = (int)((ulong)uVar2 >> 0x20);
    local_f8 = (int)uVar5;
    iStack_f4 = (int)((ulong)uVar5 >> 0x20);
    iStack_f0 = (int)uVar6;
    iStack_ec = (int)((ulong)uVar6 >> 0x20);
    *puVar18 = CONCAT44(iStack_e4 + iStack_f4,local_e8 + local_f8);
    puVar18[1] = CONCAT44(iStack_dc + iStack_ec,iStack_e0 + iStack_f0);
    puVar18 = (undefined8 *)(in_RSI + (long)(int)(local_2c0 + 0x14) * 4);
    local_108 = (int)uVar3;
    iStack_104 = (int)((ulong)uVar3 >> 0x20);
    iStack_100 = (int)uVar4;
    iStack_fc = (int)((ulong)uVar4 >> 0x20);
    local_118 = (int)uVar7;
    iStack_114 = (int)((ulong)uVar7 >> 0x20);
    iStack_110 = (int)uVar8;
    iStack_10c = (int)((ulong)uVar8 >> 0x20);
    *puVar18 = CONCAT44(iStack_104 + iStack_114,local_108 + local_118);
    puVar18[1] = CONCAT44(iStack_fc + iStack_10c,iStack_100 + iStack_110);
    uVar17 = local_2c0 + 0x18;
  }
  local_2c0 = uVar17;
  if ((in_EDX & 7) == 4) {
    puVar18 = (undefined8 *)(in_RDI + (long)(int)local_2c0 * 4);
    uVar1 = *puVar18;
    uVar2 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)local_2c0 * 4);
    uVar3 = *puVar18;
    uVar4 = puVar18[1];
    puVar18 = (undefined8 *)(in_RSI + (long)(int)local_2c0 * 4);
    local_128 = (int)uVar1;
    iStack_124 = (int)((ulong)uVar1 >> 0x20);
    iStack_120 = (int)uVar2;
    iStack_11c = (int)((ulong)uVar2 >> 0x20);
    local_138 = (int)uVar3;
    iStack_134 = (int)((ulong)uVar3 >> 0x20);
    iStack_130 = (int)uVar4;
    iStack_12c = (int)((ulong)uVar4 >> 0x20);
    *puVar18 = CONCAT44(iStack_124 + iStack_134,local_128 + local_138);
    puVar18[1] = CONCAT44(iStack_11c + iStack_12c,iStack_120 + iStack_130);
  }
  else if ((in_EDX & 7) == 2) {
    uVar1 = *(undefined8 *)(in_RDI + (long)(int)local_2c0 * 4);
    uVar2 = *(undefined8 *)(in_RSI + (long)(int)local_2c0 * 4);
    local_148 = (int)uVar1;
    iStack_144 = (int)((ulong)uVar1 >> 0x20);
    local_158 = (int)uVar2;
    iStack_154 = (int)((ulong)uVar2 >> 0x20);
    *(ulong *)(in_RSI + (long)(int)local_2c0 * 4) =
         CONCAT44(iStack_144 + iStack_154,local_148 + local_158);
  }
  return;
}

Assistant:

static void AddVectorEq_SSE2(const uint32_t* WEBP_RESTRICT a,
                             uint32_t* WEBP_RESTRICT out, int size) {
  int i = 0;
  int aligned_size = size & ~15;
  // Size is, at minimum, NUM_DISTANCE_CODES (40) and may be as large as
  // NUM_LITERAL_CODES (256) + NUM_LENGTH_CODES (24) + (0 or a non-zero power of
  // 2). See the usage in VP8LHistogramAdd().
  assert(size >= 16);
  assert(size % 2 == 0);

  do {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[i +  0]);
    const __m128i a1 = _mm_loadu_si128((const __m128i*)&a[i +  4]);
    const __m128i a2 = _mm_loadu_si128((const __m128i*)&a[i +  8]);
    const __m128i a3 = _mm_loadu_si128((const __m128i*)&a[i + 12]);
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&out[i +  0]);
    const __m128i b1 = _mm_loadu_si128((const __m128i*)&out[i +  4]);
    const __m128i b2 = _mm_loadu_si128((const __m128i*)&out[i +  8]);
    const __m128i b3 = _mm_loadu_si128((const __m128i*)&out[i + 12]);
    _mm_storeu_si128((__m128i*)&out[i +  0], _mm_add_epi32(a0, b0));
    _mm_storeu_si128((__m128i*)&out[i +  4], _mm_add_epi32(a1, b1));
    _mm_storeu_si128((__m128i*)&out[i +  8], _mm_add_epi32(a2, b2));
    _mm_storeu_si128((__m128i*)&out[i + 12], _mm_add_epi32(a3, b3));
    i += 16;
  } while (i != aligned_size);

  if ((size & 8) != 0) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[i + 0]);
    const __m128i a1 = _mm_loadu_si128((const __m128i*)&a[i + 4]);
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&out[i + 0]);
    const __m128i b1 = _mm_loadu_si128((const __m128i*)&out[i + 4]);
    _mm_storeu_si128((__m128i*)&out[i + 0], _mm_add_epi32(a0, b0));
    _mm_storeu_si128((__m128i*)&out[i + 4], _mm_add_epi32(a1, b1));
    i += 8;
  }

  size &= 7;
  if (size == 4) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[i]);
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&out[i]);
    _mm_storeu_si128((__m128i*)&out[i], _mm_add_epi32(a0, b0));
  } else if (size == 2) {
    const __m128i a0 = _mm_loadl_epi64((const __m128i*)&a[i]);
    const __m128i b0 = _mm_loadl_epi64((const __m128i*)&out[i]);
    _mm_storel_epi64((__m128i*)&out[i], _mm_add_epi32(a0, b0));
  }
}